

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcConfigListCase.cpp
# Opt level: O0

char * glcts::getConfigTypeName(ConfigType type)

{
  Exception *this;
  allocator<char> local_39;
  string local_38;
  ConfigType local_14;
  char *pcStack_10;
  ConfigType type_local;
  
  if (type == CONFIGTYPE_DEFAULT) {
    pcStack_10 = "default";
  }
  else if (type == CONFIGTYPE_EGL) {
    pcStack_10 = "EGL";
  }
  else {
    if (type != CONFIGTYPE_WGL) {
      local_14 = type;
      this = (Exception *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Unknown config type",&local_39);
      tcu::Exception::Exception(this,&local_38);
      __cxa_throw(this,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
    }
    pcStack_10 = "WGL";
  }
  return pcStack_10;
}

Assistant:

static const char* getConfigTypeName(ConfigType type)
{
	switch (type)
	{
	case CONFIGTYPE_DEFAULT:
		return "default";
	case CONFIGTYPE_EGL:
		return "EGL";
	case CONFIGTYPE_WGL:
		return "WGL";
	default:
		throw tcu::Exception("Unknown config type");
	}
}